

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O1

LinearSpace3fa * __thiscall
embree::sse2::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL>::computeAlignedSpace
          (LinearSpace3fa *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,range<unsigned_long> *set)

{
  uint uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  float fVar22;
  float fVar23;
  undefined1 auVar20 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  float fVar24;
  float fVar25;
  vfloat4 a;
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  Vec3fa axis1;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar10 = set->_begin;
  if (uVar10 < set->_end) {
    uVar8 = uVar10 << 5 | 0x1c;
    local_68 = 0;
    uStack_60 = 0x3f800000;
    uVar9 = 0xffffffffffffffff;
    do {
      uVar1 = *(uint *)((long)this->prims + (uVar8 - 0x10));
      uVar7 = CONCAT44(*(undefined4 *)((long)&(this->prims->lower).field_0 + uVar8),uVar1);
      if (uVar7 < uVar9) {
        (*(((this->scene->geometries).items[uVar1].ptr)->super_RefCount)._vptr_RefCount[0x37])
                  (&local_48);
        fVar15 = fStack_44 * fStack_44;
        fVar16 = fStack_40 * fStack_40;
        fVar17 = fStack_3c * fStack_3c;
        fVar11 = fVar15 + local_48 * local_48 + fVar16;
        fVar12 = fVar15 + fVar15 + fVar17;
        fVar16 = fVar15 + fVar16 + fVar16;
        fVar17 = fVar15 + fVar17 + fVar17;
        if (1e-18 < fVar11) {
          auVar13._4_4_ = fVar12;
          auVar13._0_4_ = fVar11;
          auVar13._8_4_ = fVar16;
          auVar13._12_4_ = fVar17;
          auVar14._4_4_ = fVar12;
          auVar14._0_4_ = fVar11;
          auVar14._8_4_ = fVar16;
          auVar14._12_4_ = fVar17;
          auVar14 = rsqrtss(auVar13,auVar14);
          fVar12 = auVar14._0_4_;
          fVar11 = fVar12 * fVar12 * fVar11 * -0.5 * fVar12 + fVar12 * 1.5;
          local_68 = CONCAT44(fStack_44 * fVar11,local_48 * fVar11);
          uStack_60 = CONCAT44(fStack_3c * fVar11,fStack_40 * fVar11);
          uVar9 = uVar7;
        }
      }
      uVar10 = uVar10 + 1;
      uVar8 = uVar8 + 0x20;
    } while (uVar10 < set->_end);
  }
  else {
    local_68 = 0;
    uStack_60 = 0x3f800000;
  }
  fVar11 = -local_68._4_4_;
  fVar12 = -(float)uStack_60;
  auVar18._8_4_ = 0xffffffff;
  auVar18._0_8_ = 0xffffffffffffffff;
  if (fVar11 * fVar11 + (float)uStack_60 * (float)uStack_60 + 0.0 <=
      (float)local_68 * (float)local_68 + fVar12 * fVar12 + 0.0) {
    auVar18 = SUB1612((undefined1  [16])0x0,0);
  }
  auVar19._0_4_ = ~auVar18._0_4_ & (uint)fVar12;
  auVar19._4_4_ = 0;
  auVar19._8_4_ = ~auVar18._8_4_ & (uint)(float)local_68;
  auVar6._4_4_ = (uint)fVar11 & auVar18._8_4_;
  auVar6._0_4_ = (uint)(float)uStack_60 & auVar18._4_4_;
  auVar6._8_4_ = 0;
  auVar19 = auVar19 | auVar6 << 0x20;
  fVar12 = auVar19._0_4_;
  fVar16 = auVar19._4_4_;
  fVar15 = auVar19._8_4_;
  fVar11 = fVar16 * fVar16;
  fVar17 = fVar15 * fVar15;
  fVar24 = fVar11 + fVar12 * fVar12 + fVar17;
  fVar25 = fVar11 + fVar11 + 0.0;
  fVar17 = fVar11 + fVar17 + fVar17;
  fVar11 = fVar11 + 0.0 + 0.0;
  auVar26._4_4_ = fVar25;
  auVar26._0_4_ = fVar24;
  auVar26._8_4_ = fVar17;
  auVar26._12_4_ = fVar11;
  auVar4._4_4_ = fVar25;
  auVar4._0_4_ = fVar24;
  auVar4._8_4_ = fVar17;
  auVar4._12_4_ = fVar11;
  auVar14 = rsqrtss(auVar26,auVar4);
  fVar11 = auVar14._0_4_;
  fVar11 = fVar11 * 1.5 - fVar11 * fVar11 * fVar24 * 0.5 * fVar11;
  fVar12 = fVar11 * fVar12;
  fVar16 = fVar11 * fVar16;
  fVar15 = fVar11 * fVar15;
  fVar17 = fVar16 * (float)local_68 - local_68._4_4_ * fVar12;
  fVar24 = fVar15 * local_68._4_4_ - (float)uStack_60 * fVar16;
  fVar25 = fVar12 * (float)uStack_60 - (float)local_68 * fVar15;
  fVar23 = fVar11 * 0.0 * uStack_60._4_4_ - uStack_60._4_4_ * fVar11 * 0.0;
  fVar11 = fVar24 * fVar24;
  fVar22 = fVar25 * fVar25;
  fVar23 = fVar23 * fVar23;
  fVar27 = fVar22 + fVar11 + fVar17 * fVar17;
  fVar28 = fVar23 + fVar11 + fVar11;
  fVar22 = fVar22 + fVar11 + fVar22;
  fVar23 = fVar23 + fVar11 + fVar23;
  auVar20._4_4_ = fVar28;
  auVar20._0_4_ = fVar27;
  auVar20._8_4_ = fVar22;
  auVar20._12_4_ = fVar23;
  auVar5._4_4_ = fVar28;
  auVar5._0_4_ = fVar27;
  auVar5._8_4_ = fVar22;
  auVar5._12_4_ = fVar23;
  auVar14 = rsqrtss(auVar20,auVar5);
  fVar11 = auVar14._0_4_;
  fVar11 = fVar11 * 1.5 - fVar11 * fVar11 * fVar27 * 0.5 * fVar11;
  aVar21.m128[1] = fVar11 * fVar25;
  aVar21.m128[0] = fVar16;
  aVar21.m128[2] = local_68._4_4_;
  aVar21.m128[3] = 0.0;
  aVar2.m128[1] = fVar11 * fVar24;
  aVar2.m128[0] = fVar12;
  aVar2.m128[2] = (float)local_68;
  aVar2.m128[3] = 0.0;
  (__return_storage_ptr__->vx).field_0 = aVar2;
  (__return_storage_ptr__->vy).field_0 = aVar21;
  aVar3.m128[1] = fVar11 * fVar17;
  aVar3.m128[0] = fVar15;
  aVar3.m128[2] = (float)uStack_60;
  aVar3.m128[3] = 0.0;
  (__return_storage_ptr__->vz).field_0 = aVar3;
  return __return_storage_ptr__;
}

Assistant:

const LinearSpace3fa computeAlignedSpace(const range<size_t>& set)
        {
          Vec3fa axis(0,0,1);
          uint64_t bestGeomPrimID = -1;

          /*! find curve with minimum ID that defines valid direction */
          for (size_t i=set.begin(); i<set.end(); i++)
          {
            const unsigned int geomID = prims[i].geomID();
            const unsigned int primID = prims[i].primID();
            const uint64_t geomprimID = prims[i].ID64();
            if (geomprimID >= bestGeomPrimID) continue;
            const Vec3fa axis1 = scene->get(geomID)->computeDirection(primID);
            if (sqr_length(axis1) > 1E-18f) {
              axis = normalize(axis1);
              bestGeomPrimID = geomprimID;
            }
          }
          return frame(axis).transposed();
        }